

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O1

void __thiscall
kratos::VarException::VarException
          (VarException *this,string *message,
          vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes)

{
  pointer ppIVar1;
  IRNode **node;
  pointer ppIVar2;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__runtime_error_002ae5e0;
  ppIVar1 = (nodes->
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (nodes->
                 super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IRNode *)0x0) {
      print_ast_node(*ppIVar2);
    }
  }
  return;
}

Assistant:

VarException::VarException(const std::string& message,
                           const std::vector<const IRNode*>& nodes) noexcept
    : std::runtime_error(message) {
    print_nodes(nodes);
}